

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

string * __thiscall
t_c_glib_generator::generate_new_hash_from_type_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *key,t_type *value)

{
  string value_free_func;
  string key_free_func;
  string cmp_func;
  string hash_func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  generate_hash_func_from_type_abi_cxx11_(&local_38,this,key);
  generate_cmp_func_from_type_abi_cxx11_(&local_58,this,key);
  generate_free_func_from_type_abi_cxx11_(&local_78,this,key);
  generate_free_func_from_type_abi_cxx11_(&local_98,this,value);
  std::operator+(&bStack_178,"g_hash_table_new_full (",&local_38);
  std::operator+(&local_158,&bStack_178,", ");
  std::operator+(&local_138,&local_158,&local_58);
  std::operator+(&local_118,&local_138,", ");
  std::operator+(&local_f8,&local_118,&local_78);
  std::operator+(&local_d8,&local_f8,", ");
  std::operator+(&local_b8,&local_d8,&local_98);
  std::operator+(__return_storage_ptr__,&local_b8,");");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&bStack_178);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::generate_new_hash_from_type(t_type* key, t_type* value) {
  string hash_func = generate_hash_func_from_type(key);
  string cmp_func = generate_cmp_func_from_type(key);
  string key_free_func = generate_free_func_from_type(key);
  string value_free_func = generate_free_func_from_type(value);

  return "g_hash_table_new_full (" + hash_func + ", " + cmp_func + ", " + key_free_func + ", "
         + value_free_func + ");";
}